

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O0

void __thiscall
COLLADASaxFWL::KinematicsBindJointAxis::KinematicsBindJointAxis
          (KinematicsBindJointAxis *this,SidAddress *target)

{
  SidAddress *in_RSI;
  undefined8 *in_RDI;
  SidAddress *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__KinematicsBindJointAxis_00dbe9a8;
  SidAddress::SidAddress(in_RSI,in_stack_ffffffffffffffe8);
  KinematicsSidrefOrParam::KinematicsSidrefOrParam((KinematicsSidrefOrParam *)0xb236c5);
  KinematicsFloatOrParam::KinematicsFloatOrParam((KinematicsFloatOrParam *)0xb236d8);
  return;
}

Assistant:

KinematicsBindJointAxis(SidAddress target) : mTarget(target){}